

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<char>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<char> *f)

{
  fill_t<wchar_t> *fill;
  size_t n;
  size_t sVar1;
  byte bVar2;
  ulong uVar3;
  size_t n_00;
  checked_ptr<typename_buffer<wchar_t>::value_type> local_38;
  
  uVar3 = (ulong)(uint)specs->width;
  n = f->size_;
  sVar1 = n;
  if (uVar3 != 0) {
    sVar1 = basic_writer<fmt::v6::buffer_range<wchar_t>_>::str_writer<char>::width(f);
  }
  n_00 = uVar3 - sVar1;
  if (uVar3 < sVar1 || n_00 == 0) {
    local_38 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,n);
    str_writer<char>::operator()((str_writer<char> *)f,&local_38);
  }
  else {
    fill = &specs->fill;
    local_38 = reserve<fmt::v6::internal::buffer<wchar_t>,_0>
                         ((back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_> *)this,
                          (specs->fill).size_ * n_00 + n);
    bVar2 = specs->field_0x9 & 0xf;
    if (bVar2 == 3) {
      local_38 = fill<wchar_t*,wchar_t>(local_38,n_00 >> 1,fill);
      str_writer<char>::operator()((str_writer<char> *)f,&local_38);
      n_00 = n_00 - (n_00 >> 1);
    }
    else {
      if (bVar2 == 2) {
        local_38 = fill<wchar_t*,wchar_t>(local_38,n_00,fill);
        str_writer<char>::operator()((str_writer<char> *)f,&local_38);
        return;
      }
      str_writer<char>::operator()((str_writer<char> *)f,&local_38);
    }
    fill<wchar_t*,wchar_t>(local_38,n_00,fill);
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }